

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O3

int __thiscall PGSStreamReader::readPacket(PGSStreamReader *this,AVPacket *avPacket)

{
  uint8_t **ppuVar1;
  double dVar2;
  bool bVar3;
  uint8_t uVar4;
  ushort uVar5;
  pointer pPVar6;
  pointer __dest;
  uint16_t uVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  ostream *poVar13;
  long *plVar14;
  long lVar15;
  int64_t iVar16;
  long lVar17;
  pointer pPVar18;
  size_t sVar19;
  bool *pbVar20;
  PESPacket *this_00;
  ulong uVar21;
  long lVar22;
  pointer __dest_00;
  uint uVar23;
  ulong uVar24;
  uint16_t tmpHeight;
  BitStreamReader bitReader;
  char local_5d;
  uint16_t local_5c;
  uint16_t local_5a;
  BitStreamReader local_58;
  bool *local_38;
  
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->codecID = 0xc;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = 0;
  avPacket->duration = 0;
  pPVar6 = (this->m_renderedBlocks).
           super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar6 != (this->m_renderedBlocks).
                super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->m_firstRenderedPacket == true) {
      avPacket->flags = 4;
    }
    this->m_firstRenderedPacket = false;
    puVar11 = pPVar6->data;
    avPacket->data = puVar11;
    uVar23 = pPVar6->len;
    uVar21 = 0x8000;
    if (uVar23 < 0x8000) {
      uVar21 = (ulong)uVar23;
    }
    avPacket->size = (int)uVar21;
    avPacket->pts = pPVar6->pts * 0xe5b0;
    avPacket->dts = pPVar6->dts * 0xe5b0;
    pPVar6->data = puVar11 + uVar21;
    pPVar6->len = uVar23 - (int)uVar21;
    if (0x8000 < uVar23) {
      return 0;
    }
    __dest = (this->m_renderedBlocks).
             super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar18 = (this->m_renderedBlocks).
              super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pPVar6 = __dest + 1;
    if (pPVar6 != pPVar18) {
      memmove(__dest,pPVar6,(long)pPVar18 - (long)pPVar6);
      pPVar18 = (this->m_renderedBlocks).
                super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->m_renderedBlocks).
    super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar18 + -1;
    this->m_firstRenderedPacket = true;
    return 0;
  }
  puVar11 = (this->super_AbstractStreamReader).m_curPos;
  if (puVar11 == (uint8_t *)0x0) {
    return 1;
  }
  if (this->m_video_height == 0) {
    intDecodeStream(this,puVar11,(long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar11);
    if (this->m_video_height == 0) {
      return 1;
    }
    text_subtitles::TextToPGSConverter::enlargeCrop
              (this->m_render,this->m_video_width,this->m_video_height,(uint16_t *)&local_58,
               &local_5a);
    uVar5 = this->m_scaled_width;
    if ((uVar5 == 0) || (uVar5 == (ushort)local_58.super_BitStream.m_totalBits)) {
      uVar7 = this->m_scaled_height;
      pbVar20 = &this->m_needRescale;
      if (uVar7 == 0) {
        this->m_needRescale = false;
      }
      else {
        this->m_needRescale = uVar7 != local_5a;
        if (uVar7 != local_5a) goto LAB_001c858b;
      }
    }
    else {
      this->m_needRescale = true;
      uVar7 = this->m_scaled_height;
LAB_001c858b:
      local_38 = &this->m_needRescale;
      uVar23 = (uint)this->m_video_height * (uint)this->m_video_width;
      uVar21 = -(ulong)(uVar23 == 0) | (ulong)uVar23;
      local_5c = uVar7;
      puVar11 = (uint8_t *)operator_new__(uVar21);
      *puVar11 = 0xff;
      memset(puVar11 + 1,0,uVar21 - 1);
      this->m_imgBuffer = puVar11;
      puVar11 = (uint8_t *)operator_new__((ulong)(uVar23 * 4));
      memset(puVar11,0,(ulong)(uVar23 * 4));
      this->m_rgbBuffer = puVar11;
      uVar23 = (uint)local_5c;
      uVar21 = (ulong)(uVar5 * uVar23 * 4);
      puVar11 = (uint8_t *)operator_new__(uVar21);
      memset(puVar11,0,uVar21);
      pbVar20 = local_38;
      this->m_scaledRgbBuffer = puVar11;
      puVar12 = (uint8_t *)operator_new__((ulong)((uVar5 + 0x10) * uVar23 + 0x4000));
      this->m_renderedData = puVar12;
      this->m_render->m_imageBuffer = puVar11;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Decoding PGS stream (track ",0x1b);
    poVar13 = (ostream *)
              std::ostream::operator<<
                        ((ostream *)&std::cout,(this->super_AbstractStreamReader).m_streamIndex);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"): ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," Resolution: ",0xd);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    local_5d = ':';
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,&local_5d,1);
    poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"  Frame rate: ",0xe);
    poVar13 = std::ostream::_M_insert<double>(this->m_frame_rate);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
    sLastMsg = true;
    dVar2 = this->m_newFps;
    if (((dVar2 != 0.0) || (NAN(dVar2))) &&
       (dVar2 = dVar2 - this->m_frame_rate, uVar21 = -(ulong)(dVar2 < -dVar2),
       0.0001 < (double)(~uVar21 & (ulong)dVar2 | (ulong)-dVar2 & uVar21))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Change FPS from ",0x10);
      poVar13 = std::ostream::_M_insert<double>(this->m_frame_rate);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
      poVar13 = std::ostream::_M_insert<double>(this->m_newFps);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," for PGS stream #",0x11);
      plVar14 = (long *)std::ostream::operator<<
                                  (poVar13,(this->super_AbstractStreamReader).m_streamIndex);
      std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
      std::ostream::put((char)plVar14);
      std::ostream::flush();
      sLastMsg = true;
      this->m_scale = this->m_frame_rate / this->m_newFps;
    }
    if (*pbVar20 == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Change PGS resolution from ",0x1b);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      local_5d = ':';
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,&local_5d,1);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13," to ",4);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      local_5d = ':';
      poVar13 = std::__ostream_insert<char,std::char_traits<char>>(poVar13,&local_5d,1);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar13,". Scaling method: Bilinear interpolation",0x28);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      sLastMsg = true;
    }
  }
  this_00 = (PESPacket *)(this->super_AbstractStreamReader).m_curPos;
  if (this->m_state == stAVPacketFragmented) {
    iVar8 = *(int *)&this->m_avFragmentEnd - (int)this_00;
    iVar10 = 0x8000;
    if (iVar8 < 0x8001) {
      this->m_state = stParsePES;
      iVar10 = iVar8;
    }
    lVar15 = this->m_lastPTS;
    avPacket->pts = lVar15;
    lVar17 = this->m_lastDTS;
    avPacket->dts = lVar17;
    avPacket->data = (uint8_t *)this_00;
    bVar3 = this->m_needRescale;
    lVar22 = (long)iVar10;
    if (bVar3 != false) {
      iVar10 = 0;
    }
    avPacket->size = iVar10;
    (this->super_AbstractStreamReader).m_curPos = &this_00->startCode0 + lVar22;
    this->m_processedSize = this->m_processedSize + lVar22;
    if (bVar3 != true) {
      return 0;
    }
    goto LAB_001c89ca;
  }
  sVar19 = (long)(this->super_AbstractStreamReader).m_bufEnd - (long)this_00;
  if (2 < (long)sVar19) {
    if (this_00->startCode0 == '\0') {
      if ((this_00->startCode1 != '\0') || (this_00->startCode2 != '\x01')) goto LAB_001c8b56;
      if ((7 < sVar19) && (uVar21 = (ulong)(byte)(this_00->m_pesHeaderLen + 9), uVar21 <= sVar19)) {
        if ((char)this_00->flagsLo < '\0') {
          iVar16 = PESPacket::getPts(this_00);
          lVar17 = iVar16 * 0xe5b0 + -0x1cb6000000000;
          if (iVar16 < 0x1ff000001) {
            lVar17 = iVar16 * 0xe5b0;
          }
          this->m_lastPTS = lVar17;
          this->m_lastDTS = lVar17;
          lVar15 = this->m_maxPTS;
          if (this->m_maxPTS < lVar17) {
            lVar15 = lVar17;
          }
          this->m_maxPTS = lVar15;
          if (0xbf < this_00->flagsLo) {
            iVar16 = PESPacket::getDts(this_00);
            lVar17 = iVar16 * 0xe5b0 + -0x1cb6000000000;
            if (iVar16 < 0x1ff000001) {
              lVar17 = iVar16 * 0xe5b0;
            }
            this->m_lastDTS = lVar17;
          }
        }
        else {
          lVar17 = this->m_lastDTS;
        }
        ppuVar1 = &(this->super_AbstractStreamReader).m_curPos;
        *ppuVar1 = *ppuVar1 + uVar21;
        this->m_processedSize = this->m_processedSize + uVar21;
        this->m_state = stParsePGS;
        lVar15 = this->m_lastPTS;
        goto LAB_001c8aeb;
      }
    }
    else {
      if ((this_00->startCode0 != 'P') || (this_00->startCode1 != 'G')) {
LAB_001c8b56:
        avPacket->data = (uint8_t *)this_00;
        uVar4 = this_00->startCode0;
        uVar7 = AV_RB16(&this_00->startCode1);
        this_00 = (PESPacket *)(this->super_AbstractStreamReader).m_curPos;
        puVar11 = (this->super_AbstractStreamReader).m_bufEnd;
        sVar19 = (long)puVar11 - (long)this_00;
        uVar21 = (ulong)uVar7;
        if ((long)(uVar21 + 3) <= (long)sVar19) {
          puVar12 = &this_00->m_streamID;
          (this->super_AbstractStreamReader).m_curPos = puVar12;
          local_58.super_BitStream.m_totalBits = 0;
          local_58.super_BitStream.m_buffer = (uint *)0x0;
          local_58.super_BitStream.m_initBuffer = (uint *)0x0;
          local_58.m_curVal = 0;
          local_58.m_bitLeft = 0;
          switch(uVar4) {
          case '\x14':
            if (this->m_needRescale == true) {
              readPalette(this,puVar12,puVar12 + uVar21);
            }
            break;
          case '\x15':
            if (this->m_needRescale == true) {
              memset(this->m_imgBuffer,0xff,(ulong)this->m_video_height * (ulong)this->m_video_width
                    );
              memset(this->m_rgbBuffer,0,
                     (ulong)this->m_video_height * (ulong)this->m_video_width * 4);
              memset(this->m_scaledRgbBuffer,0,
                     (ulong)this->m_scaled_height * (ulong)this->m_scaled_width * 4);
              puVar11 = (this->super_AbstractStreamReader).m_curPos;
              iVar10 = readObjectDef(this,puVar11,puVar11 + uVar21);
              if (iVar10 != 0) {
                puVar11 = (this->super_AbstractStreamReader).m_curPos;
                sVar19 = (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar11;
                (this->super_AbstractStreamReader).m_tmpBufferLen = sVar19;
                memmove((this->m_tmpBuffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,puVar11,sVar19);
                return 1;
              }
              renderTextShow(this,this->m_maxPTS);
            }
            break;
          case '\x16':
            dVar2 = this->m_scale + -1.0;
            uVar24 = -(ulong)(dVar2 < -dVar2);
            if (0.0001 < (double)(~uVar24 & (ulong)dVar2 | (ulong)-dVar2 & uVar24)) {
              iVar10 = calcFpsIndex(this->m_newFps);
              (this->super_AbstractStreamReader).m_curPos[4] = (char)iVar10 << 4;
              puVar12 = (this->super_AbstractStreamReader).m_curPos;
              puVar11 = (this->super_AbstractStreamReader).m_bufEnd;
            }
            BitStreamReader::setBuffer(&local_58,puVar12,puVar11);
            video_descriptor(this,&local_58);
            composition_descriptor(this,&local_58);
            BitStreamReader::skipBits(&local_58,0x10);
            uVar23 = BitStreamReader::getBits(&local_58,8);
            uVar23 = uVar23 & 0xff;
            if (uVar23 != 0) {
              do {
                composition_object(this,&local_58);
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
            }
            if ((this->composition_state != csEpochStart) && (this->m_needRescale == true)) {
              renderTextHide(this,this->m_maxPTS);
            }
            break;
          case '\x17':
            BitStreamReader::setBuffer(&local_58,puVar12,puVar11);
            uVar23 = BitStreamReader::getBits(&local_58,8);
            uVar23 = uVar23 & 0xff;
            if (uVar23 != 0) {
              do {
                pgs_window(&local_58);
                uVar23 = uVar23 - 1;
              } while (uVar23 != 0);
            }
          }
          lVar15 = this->m_lastPTS;
          avPacket->pts = lVar15;
          lVar17 = this->m_lastDTS;
          avPacket->dts = lVar17;
          if (this->m_isNewFrame == true) {
            if (this->m_needRescale == false) {
              avPacket->flags = avPacket->flags + 4;
            }
            this->m_isNewFrame = false;
          }
          puVar11 = (this->super_AbstractStreamReader).m_curPos;
          if (0x7ffd < uVar7) {
            this->m_state = stAVPacketFragmented;
            this->m_avFragmentEnd = puVar11 + uVar21;
            uVar21 = 0x7ffd;
          }
          (this->super_AbstractStreamReader).m_curPos = puVar11 + uVar21;
          this->m_processedSize = this->m_processedSize + uVar21 + 3;
          avPacket->size = (int)uVar21 + 3;
          if (this->m_needRescale != true) {
            return 0;
          }
          pPVar6 = (this->m_renderedBlocks).
                   super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (pPVar6 == (this->m_renderedBlocks).
                        super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            if (lVar17 < 1) {
              lVar17 = 0;
            }
            lVar22 = 0;
            if (0 < lVar15) {
              lVar22 = lVar15;
            }
          }
          else {
            lVar17 = pPVar6->dts * 0xe5b0;
            lVar22 = pPVar6->pts * 0xe5b0;
          }
          avPacket->dts = lVar17;
          avPacket->pts = lVar22;
          avPacket->size = 0;
          return 0;
        }
        (this->super_AbstractStreamReader).m_tmpBufferLen = sVar19;
        __dest_00 = (this->m_tmpBuffer).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
        goto LAB_001c8b91;
      }
      if (9 < sVar19) {
        uVar9 = AV_RB32(&this_00->startCode2);
        lVar15 = (ulong)uVar9 * 0xe5b0 + -0xe5b000000000;
        if (uVar9 < 0xff000001) {
          lVar15 = (ulong)uVar9 * 0xe5b0;
        }
        lVar15 = (long)((double)lVar15 * this->m_scale);
        this->m_lastPTS = lVar15;
        puVar11 = (this->super_AbstractStreamReader).m_curPos;
        if (lVar15 < this->m_maxPTS) {
          lVar15 = this->m_maxPTS;
        }
        this->m_maxPTS = lVar15;
        uVar9 = AV_RB32(puVar11 + 6);
        lVar15 = (ulong)uVar9 * 0xe5b0 + -0xe5b000000000;
        if (uVar9 < 0xff000001) {
          lVar15 = (ulong)uVar9 * 0xe5b0;
        }
        lVar17 = (long)((double)lVar15 * this->m_scale);
        lVar15 = this->m_lastPTS;
        if (lVar17 == 0) {
          lVar17 = lVar15;
        }
        this->m_lastDTS = lVar17;
        ppuVar1 = &(this->super_AbstractStreamReader).m_curPos;
        *ppuVar1 = *ppuVar1 + 10;
        this->m_processedSize = this->m_processedSize + 10;
        this->m_state = stParsePGS;
LAB_001c8aeb:
        avPacket->pts = lVar15;
        avPacket->dts = lVar17;
        this->m_isNewFrame = true;
        if (this->m_needRescale != true) {
          return 0;
        }
LAB_001c89ca:
        if (lVar17 < 1) {
          lVar17 = 0;
        }
        avPacket->dts = lVar17;
        if (lVar15 < 1) {
          lVar15 = 0;
        }
        avPacket->pts = lVar15;
        return 0;
      }
    }
  }
  (this->super_AbstractStreamReader).m_tmpBufferLen = sVar19;
  __dest_00 = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
LAB_001c8b91:
  memmove(__dest_00,this_00,sVar19);
  return 1;
}

Assistant:

int PGSStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.size = 0;
    avPacket.codec = this;
    avPacket.codecID = CODEC_S_PGS;
    avPacket.stream_index = m_streamIndex;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = 0;
    avPacket.duration = 0;

    if (!m_renderedBlocks.empty())
    {  // rendered data block (rescaled PGS). send it.
        if (m_firstRenderedPacket)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_firstRenderedPacket = false;
        PGSRenderedBlock& block = m_renderedBlocks[0];
        avPacket.data = block.data;
        avPacket.size = FFMIN(MAX_AV_PACKET_SIZE, block.len);
        avPacket.pts = block.pts * INT_FREQ_TO_TS_FREQ;
        avPacket.dts = block.dts * INT_FREQ_TO_TS_FREQ;
        block.data += avPacket.size;
        block.len -= avPacket.size;
        if (block.len == 0)
        {
            m_renderedBlocks.erase(m_renderedBlocks.begin());
            m_firstRenderedPacket = true;
        }
        return 0;
    }

    if (m_curPos == nullptr)
        return NEED_MORE_DATA;

    if (m_video_height == 0)
    {
        intDecodeStream(m_curPos, m_bufEnd - m_curPos);
        if (m_video_height == 0)
            return NEED_MORE_DATA;

        uint16_t tmpWidth;
        uint16_t tmpHeight;
        m_render->enlargeCrop(m_video_width, m_video_height, &tmpWidth, &tmpHeight);
        m_needRescale =
            (m_scaled_width && m_scaled_width != tmpWidth) || (m_scaled_height && m_scaled_height != tmpHeight);
        if (m_needRescale)
        {
            const unsigned size = m_video_width * m_video_height;
            const unsigned scaled_size = m_scaled_width * m_scaled_height;
            m_imgBuffer = new uint8_t[size]{0xff};
            m_rgbBuffer = new uint8_t[size << 2]{};
            m_scaledRgbBuffer = new uint8_t[scaled_size << 2]{};
            m_renderedData = new uint8_t[(m_scaled_width + 16) * m_scaled_height + 16384];
            m_render->setImageBuffer(m_scaledRgbBuffer);
        }
        LTRACE(LT_INFO, 2,
               "Decoding PGS stream (track " << m_streamIndex << "): "
                                             << " Resolution: " << m_video_width << ':' << m_video_height
                                             << "  Frame rate: " << m_frame_rate);
        if (m_newFps != 0.0 && fabs(m_newFps - m_frame_rate) > 1e-4)
        {
            LTRACE(LT_INFO, 2,
                   "Change FPS from " << m_frame_rate << " to " << m_newFps << " for PGS stream #" << m_streamIndex);
            m_scale = m_frame_rate / m_newFps;
        }
        if (m_needRescale)
            LTRACE(LT_INFO, 2,
                   "Change PGS resolution from " << m_video_width << ':' << m_video_height << " to " << m_scaled_width
                                                 << ':' << m_scaled_height
                                                 << ". Scaling method: Bilinear interpolation");
    }

    if (m_state == State::stAVPacketFragmented)
    {
        int avLen = static_cast<int>(m_avFragmentEnd - m_curPos);
        if (avLen > MAX_AV_PACKET_SIZE)
        {
            avLen = MAX_AV_PACKET_SIZE;
        }
        else
            m_state = State::stParsePES;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        avPacket.data = m_curPos;
        avPacket.size = m_needRescale ? 0 : avLen;
        m_curPos += avLen;
        m_processedSize += avLen;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const bool pgStartCode = m_curPos[0] == 'P' && m_curPos[1] == 'G';
    if (pgStartCode)
    {
        if (m_bufEnd - m_curPos < 10)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        m_lastPTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 2)) * m_scale);
        m_maxPTS = FFMAX(m_maxPTS, m_lastPTS);
        m_lastDTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 6)) * m_scale);
        if (m_lastDTS == 0)
            m_lastDTS = m_lastPTS;
        m_curPos += 10;
        m_processedSize += 10;
        m_state = State::stParsePGS;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;

        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    const bool pesStartCode = m_curPos[0] == 0 && m_curPos[1] == 0 && m_curPos[2] == 01;

    if (pesStartCode)
    {
        if (m_bufEnd - m_curPos < 8)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        const auto pesPacket = reinterpret_cast<PESPacket*>(m_curPos);
        const int pesHeaderLen = pesPacket->getHeaderLength();
        // if (m_bufEnd - m_curPos < pesHeaderLen+1) {
        if (m_bufEnd - m_curPos < pesHeaderLen)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        if (pesPacket->flagsLo & 0x80)
        {  // pts exists
            m_lastDTS = m_lastPTS = getTimeValueNano(pesPacket->getPts());
            m_maxPTS = FFMAX(m_lastPTS, m_maxPTS);
        }
        if ((pesPacket->flagsLo & 0xc0) == 0xc0)  // dts exists
            m_lastDTS = getTimeValueNano(pesPacket->getDts());
        m_curPos += pesHeaderLen;
        m_processedSize += pesHeaderLen;
        m_state = State::stParsePGS;

        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;
        // m_afterPesByte = *m_curPos;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    avPacket.data = m_curPos;
    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const uint8_t segment_type = *m_curPos;
    const auto segment_len = AV_RB16(m_curPos + 1);
    if (m_bufEnd - m_curPos < 3ll + segment_len)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    m_curPos += 3;
    BitStreamReader bitReader{};
    try
    {
        uint8_t number_of_composition_objects, number_of_windows;
        switch (segment_type)
        {
        case PALETTE_DEF_SEGMENT:
            // pallete definition
            // m_palleteID = m_curPos[0];
            // m_paletteVersion = m_curPos[1];
            if (m_needRescale)
                readPalette(m_curPos, m_curPos + segment_len);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " palette definition");
            break;
        case OBJECT_DEF_SEGMENT:
            // object definition
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " object definition size " << segment_len
            //	  << " objectID=" << (int)m_curPos[0] << " version=" << (int) m_curPos[2]);
            if (m_needRescale)
            {
                memset(m_imgBuffer, 0xff, static_cast<size_t>(m_video_width) * m_video_height);
                memset(m_rgbBuffer, 0x00, static_cast<size_t>(m_video_width) * m_video_height * 4);
                memset(m_scaledRgbBuffer, 0x00, static_cast<size_t>(m_scaled_width) * m_scaled_height * 4);
                if (readObjectDef(m_curPos, m_curPos + segment_len) == NEED_MORE_DATA)
                {
                    m_tmpBufferLen = m_bufEnd - m_curPos;
                    memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
                    return NEED_MORE_DATA;
                }
                renderTextShow(m_maxPTS);
            }
            break;
        case PCS_DEF_SEGMENT:
            // Presentation Composition Segment
            if (fabs(m_scale - 1.0) > 1e-4)
                m_curPos[4] = static_cast<uint8_t>(calcFpsIndex(m_newFps) << 4);
            bitReader.setBuffer(m_curPos, m_bufEnd);
            video_descriptor(bitReader);
            composition_descriptor(bitReader);

            bitReader.skipBits(16);  // palette_update_flag, palette_id_ref
            number_of_composition_objects = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_composition_objects; i++)
            {
                composition_object(bitReader);
            }
            if (composition_state != CompositionState::csEpochStart && m_needRescale)
                renderTextHide(m_maxPTS);
            break;
        case WINDOWS_DEF_SEGMENT:
            // Window Definition Segment
            bitReader.setBuffer(m_curPos, m_bufEnd);
            number_of_windows = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_windows; i++) pgs_window(bitReader);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Window Definition Segment");
            break;
        case 0x18:
            // Interactive Composition Segment
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Interactive Composition Segment");
        case 0x80:
            // End of Display Set Segment
            // m_end_display_time = get_pts(curPos);
            // curPos += 5;
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " END");
        case 0x81:
        case 0x82:
            // Used by HDMV Text subtitle streams
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " TEXT DATA");
        default:
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " unknown type " << (int)segment_type);
            break;
        }
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NEED_MORE_DATA;
    }
    avPacket.pts = m_lastPTS;
    avPacket.dts = m_lastDTS;
    if (m_isNewFrame)
    {
        if (!m_needRescale)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_isNewFrame = false;
    }

    int avLen = segment_len;
    if (avLen > MAX_AV_PACKET_SIZE - 3)
    {
        avLen = MAX_AV_PACKET_SIZE - 3;
        m_state = State::stAVPacketFragmented;
        m_avFragmentEnd = m_curPos + segment_len;
    }
    m_curPos += avLen;
    m_processedSize += 3 + avLen;
    avPacket.size = 3 + avLen;
    if (m_needRescale)
    {
        if (!m_renderedBlocks.empty())
        {
            avPacket.pts = m_renderedBlocks.begin()->pts * INT_FREQ_TO_TS_FREQ;
            avPacket.dts = m_renderedBlocks.begin()->dts * INT_FREQ_TO_TS_FREQ;
        }
        else
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        avPacket.size = 0;  // skip source palette object
    }
    return 0;
}